

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O3

string * __thiscall
ExtendedMatrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,ExtendedMatrix *this)

{
  Matrix *this_00;
  string *psVar1;
  int iVar2;
  int iVar3;
  Fraction *pFVar4;
  ostream *poVar5;
  int column;
  int i;
  char cVar6;
  ostringstream out;
  string local_1d0;
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\begin{bmatrix}",0xf);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  cVar6 = (char)(ostream *)local_1a8;
  std::ostream::put(cVar6);
  std::ostream::flush();
  this_00 = &this->extension_;
  i = 0;
  local_1b0 = __return_storage_ptr__;
  while( true ) {
    iVar2 = Matrix::GetNumRows(&this->main_);
    if (iVar2 <= i) break;
    iVar2 = 0;
    while( true ) {
      iVar3 = Matrix::GetNumColumns(&this->main_);
      if (iVar3 <= iVar2) break;
      pFVar4 = Matrix::At(&this->main_,i,iVar2);
      Fraction::ToLaTex_abi_cxx11_(&local_1d0,pFVar4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," & ",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      iVar2 = iVar2 + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\vline & ",9);
    iVar2 = 0;
    while( true ) {
      iVar3 = Matrix::GetNumColumns(this_00);
      if (iVar3 <= iVar2) break;
      pFVar4 = Matrix::At(this_00,i,iVar2);
      Fraction::ToLaTex_abi_cxx11_(&local_1d0,pFVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      iVar3 = Matrix::GetNumColumns(this_00);
      iVar2 = iVar2 + 1;
      if (iVar2 != iVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," & ",3);
      }
    }
    iVar2 = Matrix::GetNumRows(&this->main_);
    i = i + 1;
    if (i != iVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\\\",2);
    }
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\end{bmatrix}",0xd);
  psVar1 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string ExtendedMatrix::ToLaTex() const {
  std::ostringstream out;
  out << "\\begin{bmatrix}" << std::endl;
  for (int row = 0; row < GetNumRows(); ++row) {
    for (int column = 0; column < main_.GetNumColumns(); ++column) {
      out << main_.At(row, column).ToLaTex() << " & ";
    }
    out << "\\vline & ";
    for (int column = 0; column < extension_.GetNumColumns(); ++column) {
      out << extension_.At(row, column).ToLaTex();
      if (column + 1 != extension_.GetNumColumns()) {
        out << " & ";
      }
    }
    if (row + 1 != GetNumRows()) {
      out << "\\\\";
    }
    out << std::endl;
  }
  out << "\\end{bmatrix}";

  return out.str();
}